

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BatchResult * __thiscall ScanOperator::next(ScanOperator *this)

{
  pointer pbVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer __k;
  
  if (this->num_of_batches_ == 0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)0x0;
  }
  else {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)operator_new(0x30);
    BatchResult::BatchResult((BatchResult *)this_00,&this->columns_,1000);
    pbVar1 = (this->columns_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (this->columns_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
      ::operator[](this_00,__k);
    }
    this->num_of_batches_ = this->num_of_batches_ - 1;
  }
  return (BatchResult *)this_00;
}

Assistant:

BatchResult* next() final {
        if (num_of_batches_ == 0)
            return nullptr;

        uint32_t n = 1000;
        BatchResult *br = new BatchResult(columns_, n);
        // fill each col using a random numbers
        for (const auto& name : columns_) {
            DbVector* v = br->data[name];
            /*
            for (uint32_t i = 0; i < n; i++) {
                v->col[i] = (int32_t)rand();
            }
            */
        }

        num_of_batches_--;

        // printf("%d batch\n", BATCHES-num_of_batches_);
        return br;
    }